

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<ghc::cui::cell,_std::allocator<ghc::cui::cell>_> * __thiscall
ChatModel::line(vector<ghc::cui::cell,_std::allocator<ghc::cui::cell>_> *__return_storage_ptr__,
               ChatModel *this,int index,int width)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  undefined4 in_register_00000014;
  _Alloc_hider _Var7;
  ulong uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  alignment local_7c;
  undefined8 local_78;
  long local_70;
  long local_68;
  long lStack_60;
  uint local_58 [2];
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<ghc::cui::cell,_std::allocator<ghc::cui::cell>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ghc::cui::cell,_std::allocator<ghc::cui::cell>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ghc::cui::cell,_std::allocator<ghc::cui::cell>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (index < 0) {
    return __return_storage_ptr__;
  }
  uVar8 = (ulong)(uint)index;
  pCVar2 = (this->_chat).
           super__Vector_base<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_chat).
                    super__Vector_base<relive::ChatMessage,_std::allocator<relive::ChatMessage>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 5) <= uVar8) {
    return __return_storage_ptr__;
  }
  local_7c = eLeft;
  local_58[1] = 10;
  local_58[0] = 0;
  relive::formattedDuration_abi_cxx11_
            (&local_50,(relive *)(long)pCVar2[uVar8]._time,CONCAT44(in_register_00000014,index));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1d995e);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_68 = *plVar5;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar5;
    local_78 = (long *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  paVar1 = &local_a0.field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_a0.field_2._M_allocated_capacity = *psVar6;
    local_a0.field_2._8_8_ = plVar3[3];
    local_a0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar6;
    local_a0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_a0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
  emplace_back<ghc::cui::cell::alignment,int,int,std::__cxx11::string>
            ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
             &local_7c,(int *)(local_58 + 1),(int *)local_58,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  switch(pCVar2[uVar8]._type) {
  case eMe:
  case eMode:
  case eKick:
    local_78 = (long *)CONCAT44(local_78._4_4_,2);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::operator+(&local_a0,"*",
                   pCVar2[uVar8]._strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,&this->_nickLen,(uint *)&local_50,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffff00000000;
    local_78 = (long *)((ulong)local_78 & 0xffffffff00000000);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string_const&>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_a0,(int *)&local_78,(uint *)&local_50,
               *(pointer *)
                ((long)&pCVar2[uVar8]._strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 8) + -1);
    break;
  case eJoin:
    local_78 = (long *)CONCAT44(local_78._4_4_,2);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::operator+(&local_a0,"*",
                   pCVar2[uVar8]._strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,&this->_nickLen,(uint *)&local_50,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffff00000000;
    local_78 = (long *)((ulong)local_78 & 0xffffffff00000000);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,unsigned_int,char_const(&)[23]>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_a0,(int *)&local_78,(uint *)&local_50,
               (char (*) [23])"has joined the channel");
    break;
  case eLeave:
    local_78 = (long *)CONCAT44(local_78._4_4_,2);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::operator+(&local_a0,"*",
                   pCVar2[uVar8]._strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,&this->_nickLen,(uint *)&local_50,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_7c = eLeft;
    local_58[1] = 0;
    local_58[0] = 0x200000;
    uVar9 = (long)*(pointer *)
                   ((long)&pCVar2[uVar8]._strings.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8) -
            *(long *)&pCVar2[uVar8]._strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    if (uVar9 < 0x21) {
      local_78 = &local_68;
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else {
      std::operator+(&local_50,"(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&pCVar2[uVar8]._strings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0x20));
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar3[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*plVar3;
      }
      local_70 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
    }
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1d1837);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar3[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               &local_7c,(int *)(local_58 + 1),local_58,&local_a0);
    goto LAB_0012cf25;
  case eQuit:
    local_78 = (long *)CONCAT44(local_78._4_4_,2);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::operator+(&local_a0,"*",
                   pCVar2[uVar8]._strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,&this->_nickLen,(uint *)&local_50,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_7c = eLeft;
    local_58[1] = 0;
    local_58[0] = 0x200000;
    uVar9 = (long)*(pointer *)
                   ((long)&pCVar2[uVar8]._strings.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8) -
            *(long *)&pCVar2[uVar8]._strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    if (uVar9 < 0x21) {
      local_78 = &local_68;
      std::__cxx11::string::_M_construct<char_const*>();
    }
    else {
      std::operator+(&local_50,"(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)&pCVar2[uVar8]._strings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data + 0x20));
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      plVar3 = puVar4 + 2;
      if ((long *)*puVar4 == plVar3) {
        local_68 = *plVar3;
        lStack_60 = puVar4[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar3;
        local_78 = (long *)*puVar4;
      }
      local_70 = puVar4[1];
      *puVar4 = plVar3;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
    }
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1d184d);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar3[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               &local_7c,(int *)(local_58 + 1),local_58,&local_a0);
LAB_0012cf25:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((0x20 < uVar9) &&
       (_Var7._M_p = (pointer)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                       local_50._M_dataplus._M_p._0_4_),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)_Var7._M_p != &local_50.field_2)) {
LAB_0012cf68:
      operator_delete(_Var7._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    break;
  case eNick:
    local_78 = (long *)CONCAT44(local_78._4_4_,2);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::operator+(&local_a0,"*",
                   pCVar2[uVar8]._strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,&this->_nickLen,(uint *)&local_50,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_78 = (long *)((ulong)local_78 & 0xffffffff00000000);
    local_50._M_dataplus._M_p._0_4_ = 0;
    local_7c = 0x200000;
    std::operator+(&local_a0,"is now known as ",
                   *(pointer *)
                    ((long)&pCVar2[uVar8]._strings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl + 8) + -1);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,(int *)&local_50,&local_7c,&local_a0);
    goto LAB_0012cce1;
  case eTopic:
    local_78 = (long *)CONCAT44(local_78._4_4_,2);
    local_50._M_dataplus._M_p._0_4_ = 0x200000;
    std::operator+(&local_a0,"*",
                   pCVar2[uVar8]._strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int_const&,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,&this->_nickLen,(uint *)&local_50,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_78 = (long *)((ulong)local_78 & 0xffffffff00000000);
    local_50._M_dataplus._M_p._0_4_ = 0;
    local_7c = 0x200000;
    std::operator+(&local_a0,"has changed the topic to: ",
                   *(pointer *)
                    ((long)&pCVar2[uVar8]._strings.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl + 8) + -1);
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,unsigned_int,std::__cxx11::string>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_78,(int *)&local_50,&local_7c,&local_a0);
LAB_0012cce1:
    local_50.field_2._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
    _Var7._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
    goto LAB_0012cf68;
  default:
    if ((long)*(pointer *)
               ((long)&pCVar2[uVar8]._strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 8) -
        *(long *)&pCVar2[uVar8]._strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data == 0x20) {
      local_a0._M_dataplus._M_p._0_4_ = 2;
      local_78 = (long *)((ulong)local_78._4_4_ << 0x20);
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,int,char_const(&)[1]>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 (alignment *)&local_a0,&this->_nickLen,(int *)&local_78,(char (*) [1])0x1d19b8);
    }
    else {
      local_78 = (long *)CONCAT44(local_78._4_4_,2);
      local_50._M_dataplus._M_p._0_4_ = 0;
      std::operator+(&local_a0,
                     pCVar2[uVar8]._strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,":");
      std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
      emplace_back<ghc::cui::cell::alignment,int_const&,int,std::__cxx11::string>
                ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
                 (alignment *)&local_78,&this->_nickLen,(int *)&local_50,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffff00000000;
    local_78 = (long *)((ulong)local_78 & 0xffffffff00000000);
    local_50._M_dataplus._M_p._0_4_ = 0;
    std::vector<ghc::cui::cell,std::allocator<ghc::cui::cell>>::
    emplace_back<ghc::cui::cell::alignment,int,int,std::__cxx11::string_const&>
              ((vector<ghc::cui::cell,std::allocator<ghc::cui::cell>> *)__return_storage_ptr__,
               (alignment *)&local_a0,(int *)&local_78,(int *)&local_50,
               *(pointer *)
                ((long)&pCVar2[uVar8]._strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 8) + -1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ghc::cui::cell> line(int index, int width) const override
    {
        std::vector<ghc::cui::cell> result;
        if(index >= 0 && index < _chat.size()) {
            const auto& msg = _chat[index];
            result.emplace_back(ghc::cui::cell::eLeft, 10, 0, "[" + formattedDuration(msg._time) + "]");
            switch(msg._type) {
                case ChatMessage::eMe:
                case ChatMessage::eMode:
                case ChatMessage::eKick:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD,  msg._strings.back());
                    break;
                case ChatMessage::eNick:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "is now known as " + msg._strings.back());
                    break;
                case ChatMessage::eJoin:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has joined the channel");
                    break;
                case ChatMessage::eLeave:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has left the channel " + (msg._strings.size()>1 ? "("+msg._strings[1]+")":""));
                    break;
                case ChatMessage::eQuit:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has quit " + (msg._strings.size()>1 ? "("+msg._strings[1]+")":""));
                    break;
                case ChatMessage::eTopic:
                    result.emplace_back(ghc::cui::cell::eRight, _nickLen, A_BOLD, "*"+msg._strings.front());
                    result.emplace_back(ghc::cui::cell::eLeft, 0, A_BOLD, "has changed the topic to: " + msg._strings.back());
                    break;
                default:
                    if(msg._strings.size() == 1) {
                        result.emplace_back(ghc::cui::cell::eRight, _nickLen, 0, "");
                    }
                    else {
                        result.emplace_back(ghc::cui::cell::eRight, _nickLen, 0, msg._strings.front()+":");
                    }
                    result.emplace_back(ghc::cui::cell::eLeft, 0, 0, msg._strings.back());
                    break;
            }
        }
        return result;
    }